

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3InvalidFunction(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite3_context *pCtx;
  char *z;
  sqlite3_context *in_RDI;
  char *zErr;
  char *zName;
  
  pCtx = (sqlite3_context *)sqlite3_user_data(in_RDI);
  z = sqlite3_mprintf("unable to use function %s in the requested context",pCtx);
  sqlite3_result_error(pCtx,z,0);
  sqlite3_free((void *)0x14c2f6);
  return;
}

Assistant:

static void sqlite3InvalidFunction(
  sqlite3_context *context,  /* The function calling context */
  int NotUsed,               /* Number of arguments to the function */
  sqlite3_value **NotUsed2   /* Value of each argument */
){
  const char *zName = (const char*)sqlite3_user_data(context);
  char *zErr;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  zErr = sqlite3_mprintf(
      "unable to use function %s in the requested context", zName);
  sqlite3_result_error(context, zErr, -1);
  sqlite3_free(zErr);
}